

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O2

BOOL Internal_AddPaddingW(LPWSTR *Out,INT Count,LPWSTR In,INT Padding,INT Flags)

{
  LPWSTR pWVar1;
  LPWSTR pWVar2;
  int iVar3;
  errno_t eVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  bool bVar12;
  
  pWVar1 = *Out;
  sVar5 = PAL_wcslen(In);
  iVar9 = 0;
  if (0 < Padding) {
    iVar9 = Padding;
  }
  sVar11 = (size_t)Count;
  iVar3 = (int)sVar5;
  if ((Flags & 1U) != 0) {
    iVar10 = Count + -1;
    iVar6 = iVar3 + 1;
    if (iVar10 <= iVar3 + 1) {
      iVar6 = iVar10;
    }
    eVar4 = wcsncpy_s((char16_t_conflict *)*Out,sVar11,(char16_t_conflict *)In,(long)iVar6);
    if (eVar4 != 0) {
      return 0;
    }
    if (iVar3 <= iVar10) {
      iVar10 = iVar3;
    }
    *Out = *Out + iVar10;
  }
  if (0 < Padding) {
    if ((Flags & 4U) == 0) {
      while ((bVar12 = Padding != 0, Padding = Padding + -1, bVar12 &&
             (pWVar2 = *Out, (long)pWVar2 - (long)pWVar1 >> 1 < (long)sVar11))) {
        *Out = pWVar2 + 1;
        *pWVar2 = L' ';
      }
    }
    else {
      while ((bVar12 = Padding != 0, Padding = Padding + -1, bVar12 &&
             (pWVar2 = *Out, (long)pWVar2 - (long)pWVar1 >> 1 < (long)sVar11))) {
        *Out = pWVar2 + 1;
        *pWVar2 = L'0';
      }
    }
  }
  if ((Flags & 1U) == 0) {
    lVar7 = (long)*Out - (long)pWVar1 >> 1;
    sVar8 = (size_t)iVar3;
    sVar5 = (sVar11 - lVar7) - 1;
    if ((long)sVar8 < (long)sVar5) {
      sVar5 = sVar8;
    }
    eVar4 = wcsncpy_s((char16_t_conflict *)*Out,sVar11 - lVar7,(char16_t_conflict *)In,sVar5);
    if (eVar4 != 0) {
      return 0;
    }
    sVar11 = ~((long)*Out - (long)pWVar1 >> 1) + sVar11;
    if ((long)sVar8 < (long)sVar11) {
      sVar11 = sVar8;
    }
    *Out = *Out + sVar11;
  }
  return (uint)(iVar9 + iVar3 <= Count + -1);
}

Assistant:

BOOL Internal_AddPaddingW(LPWSTR *Out, INT Count, LPWSTR In, INT Padding, INT Flags)
{
    LPWSTR OutOriginal = *Out;
    INT PaddingOriginal = Padding;
    INT LengthInStr;
    LengthInStr = PAL_wcslen(In);


    if (Padding < 0)
    {
        /* this is used at the bottom to determine if the buffer ran out */
        PaddingOriginal = 0;
    }
    if (Flags & PFF_MINUS) /* pad on right */
    {
        if (wcsncpy_s(*Out, Count, In, min(LengthInStr + 1, Count - 1)) != SAFECRT_SUCCESS)
        {
            return FALSE;
        }

        *Out += min(LengthInStr, Count - 1);
    }
    if (Padding > 0)
    {
        if (Flags & PFF_ZERO) /* '0', pad with zeros */
        {
            while (Padding-- && Count > *Out - OutOriginal)
            {
                *(*Out)++ = '0';
            }
        }
        else /* pad left with spaces */
        {
            while (Padding-- && Count > *Out - OutOriginal)
            {
                *(*Out)++ = ' ';
            }
        }
    }
    if (!(Flags & PFF_MINUS)) /* put 'In' after padding */
    {
        if (wcsncpy_s(*Out, Count - (*Out - OutOriginal), In,
            min(LengthInStr, Count - (*Out - OutOriginal) - 1)) != SAFECRT_SUCCESS)
        {
            return FALSE;
        }

        *Out += min(LengthInStr, Count - (*Out - OutOriginal) - 1);
    }

    if (LengthInStr + PaddingOriginal > Count - 1)
    {
        return FALSE;
    }
    else
    {
        return TRUE;
    }
}